

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectFlatLoop<float,float,duckdb::Equals,false,true,true,true>
                (float *ldata,float *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  bool bVar4;
  sel_t sVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  long lVar14;
  
  if (count + 0x3f < 0x40) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    lVar14 = 0;
    uVar8 = 0;
    uVar12 = 0;
    do {
      puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar9 = count;
        }
LAB_00ed5562:
        uVar11 = uVar12;
        if (uVar12 < uVar9) {
          pfVar13 = ldata + uVar12;
          do {
            uVar6 = uVar12;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar6 = (ulong)sel->sel_vector[uVar12];
            }
            bVar4 = duckdb::Equals::Operation<float>(pfVar13,rdata);
            true_sel->sel_vector[iVar7] = (sel_t)uVar6;
            iVar7 = iVar7 + bVar4;
            false_sel->sel_vector[lVar14] = (sel_t)uVar6;
            lVar14 = lVar14 + (ulong)!bVar4;
            uVar12 = uVar12 + 1;
            pfVar13 = pfVar13 + 1;
            uVar11 = uVar9;
          } while (uVar9 != uVar12);
        }
      }
      else {
        uVar6 = puVar1[uVar8];
        uVar9 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar9 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_00ed5562;
        uVar11 = uVar9;
        if (uVar6 == 0) {
          if (uVar12 < uVar9) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              sVar5 = (sel_t)uVar12;
              if (psVar2 != (sel_t *)0x0) {
                sVar5 = psVar2[uVar12];
              }
              psVar3[lVar14] = sVar5;
              lVar14 = lVar14 + 1;
              uVar12 = uVar12 + 1;
            } while (uVar9 != uVar12);
          }
        }
        else {
          uVar11 = uVar12;
          if (uVar12 < uVar9) {
            pfVar13 = ldata + uVar12;
            uVar10 = 0;
            do {
              if (sel->sel_vector == (sel_t *)0x0) {
                sVar5 = (int)uVar10 + (int)uVar12;
              }
              else {
                sVar5 = sel->sel_vector[uVar12 + uVar10];
              }
              if ((uVar6 >> (uVar10 & 0x3f) & 1) == 0) {
                bVar4 = false;
              }
              else {
                bVar4 = duckdb::Equals::Operation<float>(pfVar13,rdata);
              }
              true_sel->sel_vector[iVar7] = sVar5;
              iVar7 = iVar7 + bVar4;
              false_sel->sel_vector[lVar14] = sVar5;
              lVar14 = lVar14 + (ulong)(bVar4 ^ 1);
              uVar10 = uVar10 + 1;
              pfVar13 = pfVar13 + 1;
              uVar11 = uVar9;
            } while (uVar9 - uVar12 != uVar10);
          }
        }
      }
      uVar8 = uVar8 + 1;
      uVar12 = uVar11;
    } while (uVar8 != count + 0x3f >> 6);
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}